

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_simple::test_method(addrman_simple *this)

{
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  initializer_list<CAddress> __l_01;
  bool bVar1;
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  __single_object addrman;
  CService addr2;
  CService addr1_dup;
  CAddress addr_ret1;
  CService addr1;
  CAddress addr_null;
  CNetAddr source;
  char *in_stack_fffffffffffff218;
  char *in_stack_fffffffffffff220;
  char *in_stack_fffffffffffff228;
  _Optional_payload_base<bool> _Var2;
  CService *in_stack_fffffffffffff230;
  _Optional_payload_base<Network> in_stack_fffffffffffff238;
  CService *in_stack_fffffffffffff240;
  CAddress *in_stack_fffffffffffff248;
  CService *in_stack_fffffffffffff250;
  NodeContext *in_stack_fffffffffffff258;
  iterator in_stack_fffffffffffff260;
  string *in_stack_fffffffffffff268;
  string *in_stack_fffffffffffff270;
  undefined8 in_stack_fffffffffffff300;
  uint16_t port;
  undefined1 *local_c98;
  undefined1 *local_c18;
  undefined1 *local_b70;
  const_string local_a18 [2];
  lazy_ostream local_9f8 [2];
  optional<bool> local_9d2;
  assertion_result local_9d0 [2];
  const_string local_998 [2];
  lazy_ostream local_978 [2];
  assertion_result local_958 [2];
  undefined8 local_920;
  allocator<char> local_911;
  undefined8 local_910;
  allocator<char> local_901 [29];
  int32_t local_8e4;
  const_string local_8d8 [2];
  lazy_ostream local_8b8 [2];
  optional<bool> local_892;
  assertion_result local_890 [2];
  const_string local_858 [2];
  lazy_ostream local_838 [4];
  assertion_result local_7f8 [2];
  allocator<char> local_7b9;
  undefined1 local_7b8 [8];
  undefined8 local_7b0;
  undefined1 local_7a8 [16];
  undefined1 local_798 [64];
  const_string local_758 [2];
  lazy_ostream local_738 [4];
  assertion_result local_6f8 [2];
  allocator<char> local_6b9;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [64];
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined1 local_628 [8];
  undefined8 local_620;
  undefined1 local_618 [16];
  undefined1 local_608 [64];
  const_string local_5c8 [2];
  lazy_ostream local_5a8 [4];
  assertion_result local_568 [2];
  allocator<char> local_529;
  undefined1 local_528 [16];
  undefined1 local_518 [64];
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined1 local_498 [8];
  undefined8 local_490;
  undefined1 local_488 [16];
  undefined1 local_478 [67];
  allocator<char> local_435;
  int32_t local_434;
  optional<Network> local_428;
  optional<Network> local_420;
  optional<Network> local_418;
  optional<Network> local_410;
  optional<Network> local_408 [24];
  undefined1 local_348 [56];
  undefined1 local_310 [112];
  undefined1 local_2a0 [56];
  undefined1 local_268 [72];
  undefined1 local_220 [192];
  undefined1 local_160 [56];
  undefined1 local_128 [72];
  undefined1 local_e0 [216];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_434 = GetCheckRatio(in_stack_fffffffffffff258);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_fffffffffffff250,(bool *)in_stack_fffffffffffff248,
             (int *)in_stack_fffffffffffff240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff268,(char *)in_stack_fffffffffffff260,
             (allocator<char> *)in_stack_fffffffffffff258);
  ResolveIP(in_stack_fffffffffffff270);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218);
  std::allocator<char>::~allocator(&local_435);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,(char (*) [1])in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff228 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    std::optional<Network>::optional(local_408);
    std::optional<bool>::optional((optional<bool> *)(local_498 + 6));
    local_490 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff220,
                              (optional<Network>)in_stack_fffffffffffff238,(optional<bool>)_Var2);
    local_498._0_4_ = 0;
    in_stack_fffffffffffff228 = "0U";
    in_stack_fffffffffffff220 = local_498;
    in_stack_fffffffffffff218 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_478,local_488,0x48,1,2,&local_490);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4c8 = 0;
  uStack_4c0 = 0;
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_4a8 = 0;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff218);
  AddrMan::Select((AddrMan *)in_stack_fffffffffffff230,
                  SUB81((ulong)in_stack_fffffffffffff228 >> 0x38,0),
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff220);
  CAddress::CAddress((CAddress *)in_stack_fffffffffffff228,(CAddress *)in_stack_fffffffffffff220);
  std::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *)in_stack_fffffffffffff218);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_fffffffffffff218);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,(char (*) [1])in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff250);
    in_stack_fffffffffffff228 = "\"[::]:0\"";
    in_stack_fffffffffffff220 = "[::]:0";
    in_stack_fffffffffffff218 = "addr_null.ToStringAddrPort()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_518,local_528,0x4a,1,2,local_e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff218);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff268,(char *)in_stack_fffffffffffff260,
             (allocator<char> *)in_stack_fffffffffffff258);
  ResolveService(in_stack_fffffffffffff268,(uint16_t)((ulong)in_stack_fffffffffffff300 >> 0x30));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218);
  std::allocator<char>::~allocator(&local_529);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    CService::CService((CService *)in_stack_fffffffffffff228,(CService *)in_stack_fffffffffffff220);
    CAddress::CAddress(in_stack_fffffffffffff248,in_stack_fffffffffffff240,
                       (ServiceFlags)in_stack_fffffffffffff238);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff218);
    __l._M_len = (size_type)in_stack_fffffffffffff268;
    __l._M_array = in_stack_fffffffffffff260;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff258,__l,
               (allocator_type *)in_stack_fffffffffffff250);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff228,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff220,
                 (CNetAddr *)in_stack_fffffffffffff218,(seconds)in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,
               SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_568,local_5a8,local_5c8,0x4e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff228);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff218);
    local_b70 = local_128;
    do {
      local_b70 = local_b70 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff218);
    } while (local_b70 != local_160);
    CService::~CService((CService *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,(char (*) [1])in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff228 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    std::optional<Network>::optional(&local_410);
    std::optional<bool>::optional((optional<bool> *)(local_628 + 6));
    local_620 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff220,
                              (optional<Network>)in_stack_fffffffffffff238,(optional<bool>)_Var2);
    local_628._0_4_ = 1;
    in_stack_fffffffffffff228 = "1U";
    in_stack_fffffffffffff220 = local_628;
    in_stack_fffffffffffff218 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_608,local_618,0x4f,1,2,&local_620);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
  local_648 = 0;
  uStack_640 = 0;
  local_658 = 0;
  uStack_650 = 0;
  local_668 = 0;
  uStack_660 = 0;
  local_638 = 0;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff218);
  AddrMan::Select((AddrMan *)in_stack_fffffffffffff230,
                  SUB81((ulong)in_stack_fffffffffffff228 >> 0x38,0),
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff220);
  CAddress::CAddress((CAddress *)in_stack_fffffffffffff228,(CAddress *)in_stack_fffffffffffff220);
  std::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *)in_stack_fffffffffffff218);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_fffffffffffff218);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,(char (*) [1])in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff250);
    in_stack_fffffffffffff228 = "\"250.1.1.1:8333\"";
    in_stack_fffffffffffff220 = "250.1.1.1:8333";
    in_stack_fffffffffffff218 = "addr_ret1.ToStringAddrPort()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
              (local_6a8,local_6b8,0x51,1,2,local_220);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff218);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff268,(char *)in_stack_fffffffffffff260,
             (allocator<char> *)in_stack_fffffffffffff258);
  ResolveService(in_stack_fffffffffffff268,(uint16_t)((ulong)in_stack_fffffffffffff300 >> 0x30));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218);
  std::allocator<char>::~allocator(&local_6b9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    CService::CService((CService *)in_stack_fffffffffffff228,(CService *)in_stack_fffffffffffff220);
    CAddress::CAddress(in_stack_fffffffffffff248,in_stack_fffffffffffff240,
                       (ServiceFlags)in_stack_fffffffffffff238);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff218);
    __l_00._M_len = (size_type)in_stack_fffffffffffff268;
    __l_00._M_array = in_stack_fffffffffffff260;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff258,__l_00,
               (allocator_type *)in_stack_fffffffffffff250);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff228,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff220,
                 (CNetAddr *)in_stack_fffffffffffff218,(seconds)in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,
               SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6f8,local_738,local_758,0x56,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff228);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff218);
    local_c18 = local_268;
    do {
      local_c18 = local_c18 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff218);
    } while (local_c18 != local_2a0);
    CService::~CService((CService *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,(char (*) [1])in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff228 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    std::optional<Network>::optional(&local_418);
    std::optional<bool>::optional((optional<bool> *)(local_7b8 + 6));
    local_7b0 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff220,
                              (optional<Network>)in_stack_fffffffffffff238,(optional<bool>)_Var2);
    local_7b8._0_4_ = 1;
    in_stack_fffffffffffff228 = "1U";
    in_stack_fffffffffffff220 = local_7b8;
    in_stack_fffffffffffff218 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_798,local_7a8,0x57,1,2,&local_7b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff268,(char *)in_stack_fffffffffffff260,
             (allocator<char> *)in_stack_fffffffffffff258);
  ResolveService(in_stack_fffffffffffff268,(uint16_t)((ulong)in_stack_fffffffffffff300 >> 0x30));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218);
  std::allocator<char>::~allocator(&local_7b9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    CService::CService((CService *)in_stack_fffffffffffff228,(CService *)in_stack_fffffffffffff220);
    CAddress::CAddress(in_stack_fffffffffffff248,in_stack_fffffffffffff240,
                       (ServiceFlags)in_stack_fffffffffffff238);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff218);
    __l_01._M_len = (size_type)in_stack_fffffffffffff268;
    __l_01._M_array = in_stack_fffffffffffff260;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff258,__l_01,
               (allocator_type *)in_stack_fffffffffffff250);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff228,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff220,
                 (CNetAddr *)in_stack_fffffffffffff218,(seconds)in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,
               SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7f8,local_838,local_858,0x61,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff228);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff218);
    local_c98 = local_310;
    do {
      local_c98 = local_c98 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff218);
    } while (local_c98 != local_348);
    CService::~CService((CService *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    std::optional<Network>::optional(&local_420);
    std::optional<bool>::optional(&local_892);
    AddrMan::Size((AddrMan *)in_stack_fffffffffffff220,(optional<Network>)in_stack_fffffffffffff238,
                  (_Optional_base<bool,_true,_true>)
                  SUB82((ulong)in_stack_fffffffffffff228 >> 0x30,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,
               SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_890,local_8b8,local_8d8,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    port = (uint16_t)((ulong)in_stack_fffffffffffff300 >> 0x30);
  } while (bVar1);
  local_8e4 = GetCheckRatio(in_stack_fffffffffffff258);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_fffffffffffff250,(bool *)in_stack_fffffffffffff248,
             (int *)in_stack_fffffffffffff240);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator=
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff228,
             (unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff220);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff228);
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff268,(char *)in_stack_fffffffffffff260,
             (allocator<char> *)in_stack_fffffffffffff258);
  ResolveService(in_stack_fffffffffffff268,port);
  local_910 = 0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff238,
             in_stack_fffffffffffff230,(ServiceFlags *)in_stack_fffffffffffff228);
  CService::~CService((CService *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218);
  std::allocator<char>::~allocator(local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff268,(char *)in_stack_fffffffffffff260,
             (allocator<char> *)in_stack_fffffffffffff258);
  ResolveService(in_stack_fffffffffffff268,port);
  local_920 = 0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff238,
             in_stack_fffffffffffff230,(ServiceFlags *)in_stack_fffffffffffff228);
  CService::~CService((CService *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218);
  std::allocator<char>::~allocator(&local_911);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff228,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff220,
                 (CNetAddr *)in_stack_fffffffffffff218,(seconds)in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,
               SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_958,local_978,local_998,0x69,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff258,
               (const_string *)in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248,
               (const_string *)in_stack_fffffffffffff240);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff218);
    std::optional<Network>::optional(&local_428);
    std::optional<bool>::optional(&local_9d2);
    AddrMan::Size((AddrMan *)in_stack_fffffffffffff220,(optional<Network>)in_stack_fffffffffffff238,
                  (_Optional_base<bool,_true,_true>)
                  SUB82((ulong)in_stack_fffffffffffff228 >> 0x30,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,
               SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff220,
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9d0,local_9f8,local_a18,0x6a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff228);
  CService::~CService((CService *)in_stack_fffffffffffff218);
  CService::~CService((CService *)in_stack_fffffffffffff218);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff218);
  CService::~CService((CService *)in_stack_fffffffffffff218);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff218);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff218);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff228);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_simple)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    // Test: Does Addrman respond correctly when empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    auto addr_null = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_null.ToStringAddrPort(), "[::]:0");

    // Test: Does Addrman::Add work as expected.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    auto addr_ret1 = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_ret1.ToStringAddrPort(), "250.1.1.1:8333");

    // Test: Does IP address deduplication work correctly.
    //  Expected dup IP should not be added.
    CService addr1_dup = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(!addrman->Add({CAddress(addr1_dup, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);


    // Test: New table has one addr and we add a diff addr we should
    //  have at least one addr.
    // Note that addrman's size cannot be tested reliably after insertion, as
    // hash collisions may occur. But we can always be sure of at least one
    // success.

    CService addr2 = ResolveService("250.1.1.2", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Size() >= 1);

    // Test: reset addrman and test AddrMan::Add multiple addresses works as expected
    addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    std::vector<CAddress> vAddr;
    vAddr.emplace_back(ResolveService("250.1.1.3", 8333), NODE_NONE);
    vAddr.emplace_back(ResolveService("250.1.1.4", 8333), NODE_NONE);
    BOOST_CHECK(addrman->Add(vAddr, source));
    BOOST_CHECK(addrman->Size() >= 1);
}